

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::InitFrom
          (EpsCopyInputStream *this,ZeroCopyInputStream *zcis)

{
  int iVar1;
  size_t __n;
  char *__dest;
  int size;
  void *data;
  int local_14;
  char *local_10;
  
  this->zcis_ = zcis;
  this->limit_ = 0x7fffffff;
  iVar1 = (*zcis->_vptr_ZeroCopyInputStream[2])(zcis,&local_10,&local_14);
  if ((char)iVar1 == '\0') {
    this->overall_limit_ = 0;
    this->next_chunk_ = (char *)0x0;
    this->size_ = 0;
    __dest = this->buffer_;
    this->buffer_end_ = __dest;
    this->limit_end_ = __dest;
  }
  else {
    __n = (size_t)local_14;
    this->overall_limit_ = this->overall_limit_ - local_14;
    if ((long)__n < 0x11) {
      this->buffer_end_ = this->buffer_ + 0x10;
      this->limit_end_ = this->buffer_ + 0x10;
      this->next_chunk_ = this->buffer_;
      __dest = (char *)((long)this + (0x48 - __n));
      memcpy(__dest,local_10,__n);
    }
    else {
      this->limit_ = (this->limit_ - local_14) + 0x10;
      this->buffer_end_ = local_10 + (__n - 0x10);
      this->limit_end_ = local_10 + (__n - 0x10);
      this->next_chunk_ = this->buffer_;
      __dest = local_10;
      if (this->aliasing_ == 1) {
        this->aliasing_ = 2;
      }
    }
  }
  return __dest;
}

Assistant:

const char* EpsCopyInputStream::InitFrom(io::ZeroCopyInputStream* zcis) {
  zcis_ = zcis;
  const void* data;
  int size;
  limit_ = INT_MAX;
  if (zcis->Next(&data, &size)) {
    overall_limit_ -= size;
    if (size > kSlopBytes) {
      auto ptr = static_cast<const char*>(data);
      limit_ -= size - kSlopBytes;
      limit_end_ = buffer_end_ = ptr + size - kSlopBytes;
      next_chunk_ = buffer_;
      if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
      return ptr;
    } else {
      limit_end_ = buffer_end_ = buffer_ + kSlopBytes;
      next_chunk_ = buffer_;
      auto ptr = buffer_ + 2 * kSlopBytes - size;
      std::memcpy(ptr, data, size);
      return ptr;
    }
  }
  overall_limit_ = 0;
  next_chunk_ = nullptr;
  size_ = 0;
  limit_end_ = buffer_end_ = buffer_;
  return buffer_;
}